

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O2

float __thiscall
MinVR::VRDataIndex::getValueWithDefault<float>
          (VRDataIndex *this,string *key,float *defaultVal,string *nameSpace,bool inherit)

{
  iterator iVar1;
  long *plVar2;
  float fVar3;
  string sStack_48;
  
  std::__cxx11::string::string((string *)&sStack_48,(string *)nameSpace);
  iVar1 = _getEntry(this,key,&sStack_48,inherit);
  std::__cxx11::string::~string((string *)&sStack_48);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->_theIndex)._M_t._M_impl.super__Rb_tree_header) {
    fVar3 = *defaultVal;
  }
  else {
    plVar2 = (long *)(**(code **)(**(long **)(iVar1._M_node + 2) + 0x18))();
    fVar3 = (float)(**(code **)(*plVar2 + 0x40))(plVar2);
  }
  return fVar3;
}

Assistant:

T getValueWithDefault(const std::string &key,
                        const T &defaultVal,
                        const std::string nameSpace = "",
                        const bool inherit = true) const {
    VRDataMap::iterator p =
      const_cast<VRDataIndex*>(this)->_getEntry(key, nameSpace, inherit);

    if (p == _theIndex.end()) {
      return defaultVal;
    } else {
      return p->second->getValue();
    }
  }